

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::AssertionExpr_const*>::
emplaceRealloc<slang::ast::AssertionExpr_const*>
          (SmallVectorBase<slang::ast::AssertionExpr_const*> *this,pointer pos,AssertionExpr **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppAVar3;
  AssertionExpr **__result;
  AssertionExpr **ppAVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  AssertionExpr **args_local;
  pointer pos_local;
  SmallVectorBase<const_slang::ast::AssertionExpr_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<const_slang::ast::AssertionExpr_*>::max_size
                    ((SmallVectorBase<const_slang::ast::AssertionExpr_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<const_slang::ast::AssertionExpr_*>::calculateGrowth
                       ((SmallVectorBase<const_slang::ast::AssertionExpr_*> *)this,
                        *(long *)(this + 8) + 1);
  ppAVar3 = SmallVectorBase<const_slang::ast::AssertionExpr_*>::begin
                      ((SmallVectorBase<const_slang::ast::AssertionExpr_*> *)this);
  __result = (AssertionExpr **)slang::detail::allocArray(capacity,8);
  ppAVar4 = __result + ((long)pos - (long)ppAVar3 >> 3);
  *ppAVar4 = *args;
  ppAVar3 = SmallVectorBase<const_slang::ast::AssertionExpr_*>::end
                      ((SmallVectorBase<const_slang::ast::AssertionExpr_*> *)this);
  if (pos == ppAVar3) {
    ppAVar3 = SmallVectorBase<const_slang::ast::AssertionExpr_*>::begin
                        ((SmallVectorBase<const_slang::ast::AssertionExpr_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::ast::AssertionExpr_*>::end
                    ((SmallVectorBase<const_slang::ast::AssertionExpr_*> *)this);
    std::uninitialized_move<slang::ast::AssertionExpr_const**,slang::ast::AssertionExpr_const**>
              (ppAVar3,(AssertionExpr **)ctx,__result);
  }
  else {
    ppAVar3 = SmallVectorBase<const_slang::ast::AssertionExpr_*>::begin
                        ((SmallVectorBase<const_slang::ast::AssertionExpr_*> *)this);
    std::uninitialized_move<slang::ast::AssertionExpr_const**,slang::ast::AssertionExpr_const**>
              (ppAVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::ast::AssertionExpr_*>::end
                    ((SmallVectorBase<const_slang::ast::AssertionExpr_*> *)this);
    std::uninitialized_move<slang::ast::AssertionExpr_const**,slang::ast::AssertionExpr_const**>
              (pos,(AssertionExpr **)ctx,ppAVar4 + 1);
  }
  SmallVectorBase<const_slang::ast::AssertionExpr_*>::cleanup
            ((SmallVectorBase<const_slang::ast::AssertionExpr_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(AssertionExpr ***)this = __result;
  return ppAVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}